

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_serializer.cxx
# Opt level: O2

uint32_t __thiscall nuraft::buffer_serializer::get_u32(buffer_serializer *this)

{
  byte bVar1;
  bool bVar2;
  byte *pbVar3;
  byte *pbVar4;
  overflow_error *this_00;
  uint uVar5;
  
  bVar2 = is_valid(this,4);
  if (bVar2) {
    pbVar3 = buffer::data_begin(this->buf_);
    pbVar4 = pbVar3 + this->pos_;
    if (this->endian_ == LITTLE) {
      uVar5 = (uint)pbVar4[1] << 8 | (uint)*(ushort *)(pbVar4 + 2) << 0x10;
    }
    else {
      uVar5 = ((uint)pbVar4[2] | (uint)pbVar4[1] << 8 | (uint)*pbVar4 << 0x10) << 8;
      pbVar4 = pbVar4 + 3;
    }
    bVar1 = *pbVar4;
    pos(this,this->pos_ + 4);
    return bVar1 | uVar5;
  }
  this_00 = (overflow_error *)__cxa_allocate_exception(0x10);
  std::overflow_error::overflow_error(this_00,"not enough space");
  __cxa_throw(this_00,&std::overflow_error::typeinfo,std::overflow_error::~overflow_error);
}

Assistant:

uint32_t buffer_serializer::get_u32() {
    uint32_t ret = 0;
    chk_length(ret);
    uint8_t* ptr = buf_.data_begin() + pos_;
    if (endian_ == LITTLE)  { get32l(ptr, ret); }
    else                    { get32b(ptr, ret); }
    pos( pos() + sizeof(ret) );
    return ret;
}